

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O1

Read<signed_char> __thiscall Omega_h::get_edge_codes(Omega_h *this,Mesh *mesh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  Read<signed_char> RVar3;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"collapse_code","");
  Mesh::get_array<signed_char>((Mesh *)this,(Int)mesh,(string *)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"collapse_code","");
  Mesh::remove_tag(mesh,1,&local_38);
  pvVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    pvVar2 = extraout_RDX_00;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

static Read<I8> get_edge_codes(Mesh* mesh) {
  auto edge_cand_codes = mesh->get_array<I8>(EDGE, "collapse_code");
  mesh->remove_tag(EDGE, "collapse_code");
  return edge_cand_codes;
}